

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

void amqp_e64(uint64_t val,void *data)

{
  int iVar1;
  ulong *in_RSI;
  ulong in_RDI;
  undefined8 local_8;
  
  iVar1 = is_bigendian();
  local_8 = in_RDI;
  if (iVar1 == 0) {
    local_8 = in_RDI >> 0x38 | (in_RDI & 0xff000000000000) >> 0x28 |
              (in_RDI & 0xff0000000000) >> 0x18 | (in_RDI & 0xff00000000) >> 8 |
              (in_RDI & 0xff000000) << 8 | (in_RDI & 0xff0000) << 0x18 | (in_RDI & 0xff00) << 0x28 |
              in_RDI << 0x38;
  }
  *in_RSI = local_8;
  return;
}

Assistant:

static inline void amqp_e64(uint64_t val, void *data) {
  if (!is_bigendian()) {
    val = ((val & 0xFF00000000000000u) >> 56u) |
          ((val & 0x00FF000000000000u) >> 40u) |
          ((val & 0x0000FF0000000000u) >> 24u) |
          ((val & 0x000000FF00000000u) >> 8u) |
          ((val & 0x00000000FF000000u) << 8u) |
          ((val & 0x0000000000FF0000u) << 24u) |
          ((val & 0x000000000000FF00u) << 40u) |
          ((val & 0x00000000000000FFu) << 56u);
  }
  memcpy(data, &val, sizeof(val));
}